

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  int *pnList;
  char *pcVar1;
  u8 uVar2;
  Fts3Expr *pFVar3;
  Fts3Expr *pFVar4;
  bool bVar5;
  u8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *__dest;
  int iVar10;
  long lVar11;
  TokenDoclist *p;
  char **ppcVar12;
  long lVar13;
  Fts3Expr *pFVar14;
  Fts3Table *pFVar15;
  long lVar16;
  Fts3Phrase *pFVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  char *pR;
  char *pL;
  TokenDoclist a [4];
  u8 local_119;
  Fts3Phrase *local_118;
  u8 local_109;
  int *local_108;
  Fts3Expr *local_100;
  u8 *local_f8;
  Fts3Table *local_f0;
  ulong local_e8;
  char *local_e0;
  Fts3Table *local_d8;
  ulong local_d0;
  char *local_c8 [2];
  TokenDoclist local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (*pRc != 0) {
    return;
  }
  uVar2 = pCsr->bDesc;
  pExpr->bStart = '\x01';
  local_100 = pExpr;
  local_108 = pRc;
  switch(pExpr->eType) {
  case 1:
  case 3:
    pFVar3 = pExpr->pLeft;
    pFVar4 = pExpr->pRight;
    if (pFVar3->bDeferred == '\0') {
      uVar6 = pFVar4->bDeferred;
      fts3EvalNextRow(pCsr,pFVar3,pRc);
      pFVar14 = pFVar4;
      if (uVar6 == '\0') {
        while (fts3EvalNextRow(pCsr,pFVar14,local_108), pFVar3->bEof == '\0') {
          uVar6 = pFVar4->bEof;
          if (uVar6 != '\0') {
            lVar11 = pFVar3->iDocid;
LAB_001d4b95:
            local_100->iDocid = lVar11;
            bVar20 = uVar6 != '\0';
            goto LAB_001d4ba3;
          }
          lVar11 = pFVar3->iDocid;
          if (*local_108 != 0) goto LAB_001d4b95;
          lVar16 = lVar11 - pFVar4->iDocid;
          lVar19 = -lVar16;
          if (uVar2 == '\0') {
            lVar19 = lVar16;
          }
          if (lVar19 == 0) goto LAB_001d4b95;
          pFVar14 = pFVar3;
          if (-1 < lVar19) {
            pFVar14 = pFVar4;
          }
        }
        local_100->iDocid = pFVar3->iDocid;
        bVar20 = true;
LAB_001d4ba3:
        local_100->bEof = bVar20;
        if ((local_100->eType == 1) && (bVar20 != false)) {
          pFVar17 = pFVar4->pPhrase;
          if ((pFVar17->doclist).aAll != (char *)0x0) {
            while ((*local_108 == 0 && (pFVar4->bEof == '\0'))) {
              memset((pFVar17->doclist).pList,0,(long)(pFVar17->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar4,local_108);
            }
          }
          pFVar17 = pFVar3->pPhrase;
          if ((pFVar17 != (Fts3Phrase *)0x0) && ((pFVar17->doclist).aAll != (char *)0x0)) {
            iVar7 = *local_108;
            while ((iVar7 == 0 && (pFVar3->bEof == '\0'))) {
              memset((pFVar17->doclist).pList,0,(long)(pFVar17->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar3,local_108);
              iVar7 = *local_108;
            }
          }
        }
      }
      else {
        local_100->iDocid = pFVar3->iDocid;
        local_100->bEof = pFVar3->bEof;
      }
    }
    else {
      fts3EvalNextRow(pCsr,pFVar4,pRc);
      pExpr->iDocid = pFVar4->iDocid;
      pExpr->bEof = pFVar4->bEof;
    }
    break;
  case 2:
    pFVar3 = pExpr->pLeft;
    pFVar4 = pExpr->pRight;
    if (pFVar4->bStart == '\0') {
      fts3EvalNextRow(pCsr,pFVar4,pRc);
    }
    fts3EvalNextRow(pCsr,pFVar3,pRc);
    uVar6 = pFVar3->bEof;
    if (uVar6 == '\0') {
      if (*pRc == 0) {
        while (pFVar4->bEof == '\0') {
          lVar19 = pFVar3->iDocid - pFVar4->iDocid;
          lVar11 = -lVar19;
          if (uVar2 == '\0') {
            lVar11 = lVar19;
          }
          if ((lVar11 < 1) || (fts3EvalNextRow(pCsr,pFVar4,pRc), *pRc != 0)) break;
        }
        uVar6 = pFVar3->bEof;
      }
      else {
        uVar6 = '\0';
      }
    }
    pExpr->iDocid = pFVar3->iDocid;
    pExpr->bEof = uVar6;
    break;
  case 4:
    pFVar3 = pExpr->pLeft;
    pFVar4 = pExpr->pRight;
    uVar18 = -(ulong)(uVar2 != '\0') | 1;
    pFVar14 = pFVar3;
    if (pFVar4->bEof == '\0') {
      lVar11 = (pFVar3->iDocid - pFVar4->iDocid) * uVar18;
      if ((((pFVar3->bEof != '\0') || (-1 < lVar11)) && (pFVar14 = pFVar4, pFVar3->bEof == '\0')) &&
         (lVar11 < 1)) {
        fts3EvalNextRow(pCsr,pFVar3,pRc);
      }
    }
    fts3EvalNextRow(pCsr,pFVar14,pRc);
    if (pFVar3->bEof == '\0') {
      bVar20 = false;
    }
    else {
      bVar20 = pFVar4->bEof != '\0';
    }
    pExpr->bEof = bVar20;
    lVar11 = pFVar3->iDocid;
    if ((pFVar4->bEof == '\0') &&
       ((pFVar3->bEof != '\0' || (-1 < (long)((lVar11 - pFVar4->iDocid) * uVar18))))) {
      pExpr->iDocid = pFVar4->iDocid;
      return;
    }
    goto LAB_001d4b76;
  default:
    local_118 = pExpr->pPhrase;
    if ((local_118->doclist).bFreeList != 0) {
      sqlite3_free((local_118->doclist).pList);
    }
    (local_118->doclist).pList = (char *)0x0;
    pnList = &(local_118->doclist).nList;
    (local_118->doclist).nList = 0;
    (local_118->doclist).bFreeList = 0;
    local_f8 = &pExpr->bEof;
    local_f0 = (Fts3Table *)(pCsr->base).pVtab;
    if (local_118->bIncr != 0) {
      local_119 = '\0';
      if (local_118->nToken != 1) {
        local_109 = pCsr->bDesc;
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98 = 0;
        uStack_90 = 0;
        local_b8.pList = (char *)0x0;
        local_b8.nList = 0;
        local_b8._28_4_ = 0;
        local_b8.bIgnore = 0;
        local_b8._4_4_ = 0;
        local_b8.iDocid = 0;
        local_e8 = -(ulong)(local_109 != '\0') | 1;
        iVar7 = 0;
        pFVar15 = (Fts3Table *)0x0;
        do {
          p = &local_b8;
          if (iVar7 == 0) {
            lVar19 = 0;
            bVar20 = false;
            lVar11 = 0;
            do {
              pFVar15 = (Fts3Table *)CONCAT71((int7)((ulong)pFVar15 >> 8),local_119);
              lVar16 = lVar11;
              iVar7 = 0;
              if ((local_118->nToken <= lVar19) || (local_119 != '\0')) goto LAB_001d4821;
              pFVar15 = local_f0;
              iVar7 = incrPhraseTokenNext(local_f0,local_118,(int)lVar19,p,&local_119);
              bVar5 = bVar20;
              if (p->bIgnore == 0) {
                lVar16 = p->iDocid;
                bVar5 = true;
                if (bVar20) {
                  lVar13 = -(lVar11 - lVar16);
                  if (local_109 == '\0') {
                    lVar13 = lVar11 - lVar16;
                  }
                  if (-1 < lVar13) {
                    lVar16 = lVar11;
                  }
                }
              }
              bVar20 = bVar5;
              lVar19 = lVar19 + 1;
              p = p + 1;
              lVar11 = lVar16;
            } while (iVar7 == 0);
            pFVar15 = (Fts3Table *)CONCAT71((int7)((ulong)pFVar15 >> 8),local_119);
          }
          else {
            lVar16 = 0;
          }
LAB_001d4821:
          iVar8 = local_118->nToken;
          pFVar17 = local_118;
          if (0 < iVar8) {
            iVar10 = 0;
            uVar18 = (ulong)pFVar15 & 0xffffffff;
            do {
              if ((iVar7 == 0) && ((char)uVar18 == '\0')) {
                lVar11 = (long)iVar10;
                uVar18 = 0;
                if ((&local_b8)[lVar11].bIgnore == 0) {
                  uVar18 = 0;
                  iVar7 = 0;
                  lVar19 = lVar16;
                  if ((long)(((&local_b8)[lVar11].iDocid - lVar16) * local_e8) < 0) {
                    do {
                      pFVar15 = local_f0;
                      iVar7 = incrPhraseTokenNext(local_f0,pFVar17,iVar10,&local_b8 + lVar11,
                                                  &local_119);
                      lVar16 = (&local_b8)[lVar11].iDocid;
                      iVar8 = 0;
                      if ((long)(((&local_b8)[lVar11].iDocid - lVar19) * local_e8) < 1) {
                        lVar16 = lVar19;
                        iVar8 = iVar10;
                      }
                      iVar10 = iVar8;
                      pFVar15 = (Fts3Table *)CONCAT71((int7)((ulong)pFVar15 >> 8),local_119);
                      pFVar17 = local_118;
                      if ((iVar7 != 0) || (local_119 != '\0')) goto LAB_001d4910;
                      lVar11 = (long)iVar10;
                    } while (((&local_b8)[lVar11].bIgnore == 0) &&
                            (lVar19 = lVar16,
                            (long)(((&local_b8)[lVar11].iDocid - lVar16) * local_e8) < 0));
                    pFVar15 = (Fts3Table *)0x0;
LAB_001d4910:
                    iVar8 = local_118->nToken;
                    uVar18 = (ulong)pFVar15 & 0xffffffff;
                  }
                }
                else {
                  iVar7 = 0;
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < iVar8);
          }
          if ((char)pFVar15 != '\0') goto LAB_001d4b5d;
          iVar8 = *(int *)(local_c8 + (long)iVar8 * 4U + 1);
          local_d8 = pFVar15;
          __dest = (char *)sqlite3_malloc(iVar8 + 8);
          pFVar17 = local_118;
          if (__dest == (char *)0x0) {
            iVar7 = 7;
            goto LAB_001d4b6f;
          }
          memcpy(__dest,local_c8[(long)local_118->nToken * 4],(long)iVar8 + 1);
          pcVar1 = __dest + iVar8;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          iVar8 = pFVar17->nToken;
          lVar11 = 0;
          if (iVar8 < 2) {
            uVar18 = 0;
          }
          else {
            lVar11 = 0;
            iVar10 = -1;
            ppcVar12 = &local_b8.pList;
            uVar18 = 0;
            do {
              if (((TokenDoclist *)(ppcVar12 + -2))->bIgnore == 0) {
                local_c8[1] = *ppcVar12;
                local_e0 = __dest;
                local_d0 = uVar18;
                local_c8[0] = __dest;
                iVar9 = fts3PoslistPhraseMerge(&local_e0,iVar8 + iVar10,0,1,local_c8 + 1,local_c8);
                iVar8 = local_118->nToken;
                uVar18 = local_d0;
                pFVar17 = local_118;
                if (iVar9 == 0) break;
                uVar18 = (ulong)(uint)((int)local_e0 - (int)__dest);
              }
              lVar11 = lVar11 + 1;
              iVar10 = iVar10 + -1;
              ppcVar12 = ppcVar12 + 4;
            } while (lVar11 < iVar8 + -1);
          }
          if ((int)lVar11 == iVar8 + -1) goto LAB_001d4b47;
          sqlite3_free(__dest);
          pFVar15 = local_d8;
        } while( true );
      }
      iVar7 = sqlite3Fts3MsrIncrNext
                        (local_f0,local_118->aToken[0].pSegcsr,&(local_118->doclist).iDocid,
                         &(local_118->doclist).pList,pnList);
      pFVar15 = (Fts3Table *)(ulong)((local_118->doclist).pList == (char *)0x0);
      pFVar17 = local_118;
      goto LAB_001d4b5d;
    }
    if ((pCsr->bDesc == local_f0->bDescIdx) || (iVar7 = (local_118->doclist).nAll, iVar7 == 0)) {
      fts3EvalDlPhraseNext(local_f0,&local_118->doclist,local_f8);
    }
    else {
      sqlite3Fts3DoclistPrev
                ((uint)local_f0->bDescIdx,(local_118->doclist).aAll,iVar7,
                 &(local_118->doclist).pNextDocid,&(local_118->doclist).iDocid,pnList,local_f8);
      (local_118->doclist).pList = (local_118->doclist).pNextDocid;
    }
    iVar7 = 0;
    goto LAB_001d4b6f;
  }
  return;
LAB_001d4b47:
  (pFVar17->doclist).iDocid = lVar16;
  (pFVar17->doclist).pList = __dest;
  (pFVar17->doclist).nList = (int)uVar18;
  (pFVar17->doclist).bFreeList = 1;
  pFVar15 = (Fts3Table *)0x0;
LAB_001d4b5d:
  *local_f8 = (u8)pFVar15;
  local_118 = pFVar17;
LAB_001d4b6f:
  *local_108 = iVar7;
  lVar11 = (local_118->doclist).iDocid;
LAB_001d4b76:
  local_100->iDocid = lVar11;
  return;
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    assert( pExpr->bEof==0 );
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            assert( pRight->eType==FTSQUERY_PHRASE );
            if( pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
          }
        }
        break;
      }
  
      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || iCmp>0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc 
              && !pRight->bEof 
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0 
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}